

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

const_iterator __thiscall
frozen::set<frozen::basic_string<char>,_3UL,_std::less<frozen::basic_string<char>_>_>::
lower_bound<char[2]>
          (set<frozen::basic_string<char>,_3UL,_std::less<frozen::basic_string<char>_>_> *this,
          char (*key) [2])

{
  ulong uVar1;
  const_iterator pvVar2;
  bool bVar3;
  
  bVar3 = (this->keys_).data_[1].size_ == 0;
  if (!bVar3) {
    bVar3 = *(this->keys_).data_[1].data_ < (*key)[0];
  }
  uVar1 = (ulong)bVar3;
  bVar3 = (this->keys_).data_[uVar1 * 2].size_ == 0;
  if (!bVar3) {
    bVar3 = *(this->keys_).data_[uVar1 * 2].data_ < (*key)[0];
  }
  uVar1 = (ulong)bVar3 << 4 | uVar1 * 0x20;
  if (uVar1 == 0x30) goto LAB_00188647;
  pvVar2 = (const_iterator)((long)&(this->keys_).data_[0].data_ + uVar1);
  if (pvVar2->size_ == 0) {
LAB_00188637:
    bVar3 = 1 < pvVar2->size_;
  }
  else {
    if ((*key)[0] == *pvVar2->data_) goto LAB_00188637;
    bVar3 = (*key)[0] < *pvVar2->data_;
  }
  if (!bVar3) {
    return pvVar2;
  }
LAB_00188647:
  return (const_iterator)(this + 1);
}

Assistant:

constexpr bool operator<(const basic_string &other) const {
    unsigned i = 0;
    while (i < size() && i < other.size()) {
      if ((*this)[i] < other[i]) {
        return true;
      }
      if ((*this)[i] > other[i]) {
        return false;
      }
      ++i;
    }
    return size() < other.size();
  }